

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_hash.cpp
# Opt level: O2

void duckdb::VectorOperations::CombineHash(Vector *hashes,Vector *input,idx_t count)

{
  data_ptr_t pdVar1;
  PhysicalType PVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  Vector *pVVar5;
  idx_t iVar6;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  reference pvVar7;
  type pVVar8;
  InvalidTypeException *this_00;
  idx_t j_2;
  ulong uVar9;
  size_type __n;
  UnifiedVectorFormat *this_01;
  idx_t i_1;
  idx_t iVar10;
  ulong uVar11;
  idx_t j;
  idx_t iVar12;
  ulong uVar13;
  idx_t i_2;
  ulong uVar14;
  ulong uVar15;
  idx_t iVar16;
  ulong uVar17;
  ulong uVar18;
  SelectionVector array_sel;
  sel_t *local_160 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  Vector child_hashes;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat idata_1;
  
  PVar2 = (input->type).physical_type_;
  switch(PVar2) {
  case BOOL:
  case INT8:
    TemplatedLoopCombineHash<false,signed_char>(input,hashes,(SelectionVector *)0x0,count);
    return;
  case UINT8:
    TemplatedLoopCombineHash<false,unsigned_char>(input,hashes,(SelectionVector *)0x0,count);
    return;
  case UINT16:
    TemplatedLoopCombineHash<false,unsigned_short>(input,hashes,(SelectionVector *)0x0,count);
    return;
  case INT16:
    TemplatedLoopCombineHash<false,short>(input,hashes,(SelectionVector *)0x0,count);
    return;
  case UINT32:
    TemplatedLoopCombineHash<false,unsigned_int>(input,hashes,(SelectionVector *)0x0,count);
    return;
  case INT32:
    TemplatedLoopCombineHash<false,int>(input,hashes,(SelectionVector *)0x0,count);
    return;
  case UINT64:
    TemplatedLoopCombineHash<false,unsigned_long>(input,hashes,(SelectionVector *)0x0,count);
    return;
  case INT64:
    TemplatedLoopCombineHash<false,long>(input,hashes,(SelectionVector *)0x0,count);
    return;
  case FLOAT:
    TemplatedLoopCombineHash<false,float>(input,hashes,(SelectionVector *)0x0,count);
    return;
  case DOUBLE:
    TemplatedLoopCombineHash<false,double>(input,hashes,(SelectionVector *)0x0,count);
    return;
  case INTERVAL:
    TemplatedLoopCombineHash<false,duckdb::interval_t>(input,hashes,(SelectionVector *)0x0,count);
    return;
  case LIST:
    Vector::Flatten(hashes,count);
    pdVar3 = hashes->data;
    UnifiedVectorFormat::UnifiedVectorFormat(&idata_1);
    Vector::ToUnifiedFormat(input,count,&idata_1);
    pVVar5 = ListVector::GetEntry(input);
    iVar6 = ListVector::GetListSize(input);
    LogicalType::LogicalType((LogicalType *)&idata,UBIGINT);
    Vector::Vector(&child_hashes,(LogicalType *)&idata,iVar6);
    LogicalType::~LogicalType((LogicalType *)&idata);
    if (iVar6 != 0) {
      Hash(pVVar5,&child_hashes,iVar6);
      Vector::Flatten(&child_hashes,iVar6);
    }
    SelectionVector::SelectionVector(&array_sel,count);
    SelectionVector::SelectionVector((SelectionVector *)local_160,count);
    uVar18 = 0;
    for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
      iVar16 = iVar6;
      if ((idata_1.sel)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(idata_1.sel)->sel_vector[iVar6];
      }
      if (((idata_1.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((idata_1.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar16 >> 6]
            >> (iVar16 & 0x3f) & 1) != 0)) &&
         (*(long *)((long)(idata_1.data + iVar16 * 0x10) + 8) != 0)) {
        array_sel.sel_vector[uVar18] = (sel_t)iVar6;
        uVar18 = uVar18 + 1;
        local_160[0][iVar6] = *(sel_t *)(idata_1.data + iVar16 * 0x10);
      }
    }
    if (uVar18 != 0) {
      psVar4 = (idata_1.sel)->sel_vector;
      uVar11 = 1;
      do {
        uVar13 = 0;
        for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
          uVar15 = uVar14;
          if (array_sel.sel_vector != (sel_t *)0x0) {
            uVar15 = (ulong)array_sel.sel_vector[uVar14];
          }
          uVar9 = uVar15;
          if (local_160[0] != (sel_t *)0x0) {
            uVar9 = (ulong)local_160[0][uVar15];
          }
          uVar17 = *(ulong *)(pdVar3 + uVar15 * 8);
          *(ulong *)(pdVar3 + uVar15 * 8) =
               (uVar17 >> 0x20 ^ uVar17) * -0x2917014799a6026d ^
               *(ulong *)(child_hashes.data + uVar9 * 8);
          uVar17 = uVar15;
          if (psVar4 != (sel_t *)0x0) {
            uVar17 = (ulong)psVar4[uVar15];
          }
          if (uVar11 < *(ulong *)(idata_1.data + uVar17 * 0x10 + 8)) {
            array_sel.sel_vector[uVar13] = (sel_t)uVar15;
            uVar13 = uVar13 + 1;
            local_160[0][uVar15] = (int)uVar9 + 1;
          }
        }
        uVar11 = uVar11 + 1;
        uVar18 = uVar13;
      } while (uVar13 != 0);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&array_sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Vector::~Vector(&child_hashes);
    this_01 = &idata_1;
    break;
  case STRUCT:
    this = StructVector::GetEntries(input);
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             ::get<true>(this,0);
    pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (pvVar7);
    CombineHash(hashes,pVVar8,count);
    for (__n = 1; __n < (ulong)((long)(this->
                                      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->
                                      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1
        ) {
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::get<true>(this,__n);
      pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (pvVar7);
      CombineHash(hashes,pVVar8,count);
    }
    return;
  case ARRAY:
    Vector::Flatten(hashes,count);
    pdVar3 = hashes->data;
    UnifiedVectorFormat::UnifiedVectorFormat(&idata);
    Vector::ToUnifiedFormat(input,count,&idata);
    pVVar5 = ArrayVector::GetEntry(input);
    iVar6 = ArrayType::GetSize(&input->type);
    if ((input->vector_type & ~CONSTANT_VECTOR) == FLAT_VECTOR) {
      iVar16 = 1;
      if (input->vector_type != CONSTANT_VECTOR) {
        iVar16 = count;
      }
      LogicalType::LogicalType((LogicalType *)&idata_1,UBIGINT);
      iVar16 = iVar16 * iVar6;
      Vector::Vector(&child_hashes,(LogicalType *)&idata_1,iVar16);
      LogicalType::~LogicalType((LogicalType *)&idata_1);
      Hash(pVVar5,&child_hashes,iVar16);
      Vector::Flatten(&child_hashes,iVar16);
      for (iVar16 = 0; iVar16 != count; iVar16 = iVar16 + 1) {
        iVar10 = iVar16;
        if ((idata.sel)->sel_vector != (sel_t *)0x0) {
          iVar10 = (idx_t)(idata.sel)->sel_vector[iVar16];
        }
        if ((idata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((idata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar10 >> 6] >>
             (iVar10 & 0x3f) & 1) != 0)) {
          for (iVar12 = 0; iVar6 != iVar12; iVar12 = iVar12 + 1) {
            *(ulong *)(pdVar3 + iVar16 * 8) =
                 (*(ulong *)(pdVar3 + iVar16 * 8) >> 0x20 ^ *(ulong *)(pdVar3 + iVar16 * 8)) *
                 -0x2917014799a6026d ^
                 *(ulong *)(child_hashes.data + iVar12 * 8 + iVar10 * iVar6 * 8);
          }
        }
      }
      Vector::~Vector(&child_hashes);
    }
    else {
      SelectionVector::SelectionVector(&array_sel,iVar6);
      LogicalType::LogicalType((LogicalType *)local_160,UBIGINT);
      Vector::Vector(&child_hashes,(LogicalType *)local_160,iVar6);
      LogicalType::~LogicalType((LogicalType *)local_160);
      for (uVar18 = 0; uVar18 != count; uVar18 = uVar18 + 1) {
        uVar11 = uVar18;
        if ((idata.sel)->sel_vector != (sel_t *)0x0) {
          uVar11 = (ulong)(idata.sel)->sel_vector[uVar18];
        }
        if ((idata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((idata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar11 >> 6] >>
             (uVar11 & 0x3f) & 1) != 0)) {
          for (iVar16 = 0; iVar6 != iVar16; iVar16 = iVar16 + 1) {
            array_sel.sel_vector[iVar16] = (int)uVar11 * (int)iVar6 + (int)iVar16;
          }
          Vector::Vector((Vector *)&idata_1,pVVar5,&array_sel,iVar6);
          Hash((Vector *)&idata_1,&child_hashes,iVar6);
          for (iVar16 = 0; iVar6 != iVar16; iVar16 = iVar16 + 1) {
            *(ulong *)(pdVar3 + uVar18 * 8) =
                 (*(ulong *)(pdVar3 + uVar18 * 8) >> 0x20 ^ *(ulong *)(pdVar3 + uVar18 * 8)) *
                 -0x2917014799a6026d ^ *(ulong *)(child_hashes.data + iVar16 * 8);
            pdVar1 = child_hashes.data + iVar16 * 8;
            pdVar1[0] = '\0';
            pdVar1[1] = '\0';
            pdVar1[2] = '\0';
            pdVar1[3] = '\0';
            pdVar1[4] = '\0';
            pdVar1[5] = '\0';
            pdVar1[6] = '\0';
            pdVar1[7] = '\0';
          }
          Vector::~Vector((Vector *)&idata_1);
        }
      }
      Vector::~Vector(&child_hashes);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&array_sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    this_01 = &idata;
    break;
  default:
    if (PVar2 == VARCHAR) {
      TemplatedLoopCombineHash<false,duckdb::string_t>(input,hashes,(SelectionVector *)0x0,count);
      return;
    }
    if (PVar2 == UINT128) {
      TemplatedLoopCombineHash<false,duckdb::uhugeint_t>(input,hashes,(SelectionVector *)0x0,count);
      return;
    }
    if (PVar2 == INT128) {
      TemplatedLoopCombineHash<false,duckdb::hugeint_t>(input,hashes,(SelectionVector *)0x0,count);
      return;
    }
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case STRUCT|BOOL:
  case STRUCT|UINT8:
  case STRUCT|INT8:
  case STRUCT|UINT16:
    this_00 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&child_hashes,"Invalid type for hash",(allocator *)&idata_1);
    InvalidTypeException::InvalidTypeException(this_00,&input->type,(string *)&child_hashes);
    __cxa_throw(this_00,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(this_01);
  return;
}

Assistant:

void VectorOperations::CombineHash(Vector &hashes, Vector &input, idx_t count) {
	CombineHashTypeSwitch<false>(hashes, input, nullptr, count);
}